

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O0

void __thiscall cmDependsC::~cmDependsC(cmDependsC *this)

{
  cmDependsC *this_local;
  
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsC_00a43b30;
  WriteCacheFile(this);
  cmDeleteAll<std::map<std::__cxx11::string,cmDependsC::cmIncludeLines*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDependsC::cmIncludeLines*>>>>
            (&this->FileCache);
  std::__cxx11::string::~string((string *)&this->CacheFileName);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->HeaderLocationCache);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
  ::~map(&this->FileCache);
  std::
  queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  ::~queue(&this->Unscanned);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->Encountered);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->TransformRules);
  cmsys::RegularExpression::~RegularExpression(&this->IncludeRegexTransform);
  std::__cxx11::string::~string((string *)&this->IncludeRegexTransformString);
  std::__cxx11::string::~string((string *)&this->IncludeRegexComplainString);
  std::__cxx11::string::~string((string *)&this->IncludeRegexScanString);
  std::__cxx11::string::~string((string *)&this->IncludeRegexLineString);
  cmsys::RegularExpression::~RegularExpression(&this->IncludeRegexComplain);
  cmsys::RegularExpression::~RegularExpression(&this->IncludeRegexScan);
  cmsys::RegularExpression::~RegularExpression(&this->IncludeRegexLine);
  cmDepends::~cmDepends(&this->super_cmDepends);
  return;
}

Assistant:

cmDependsC::~cmDependsC()
{
  this->WriteCacheFile();
  cmDeleteAll(this->FileCache);
}